

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

bool __thiscall glslang::HlslParseContext::hasInput(HlslParseContext *this,TQualifier *qualifier)

{
  uint uVar1;
  EShLanguage EVar2;
  byte bVar3;
  
  if ((*(ulong *)&qualifier->field_0x1c & 0xff000000007fff) != 0xff000000004fff) {
    return true;
  }
  EVar2 = (this->super_TParseContextBase).super_TParseVersions.language;
  if (EVar2 == EShLangTessEvaluation) {
    if ((qualifier->field_0xd & 0x10) != 0) {
      return true;
    }
  }
  else if ((EVar2 == EShLangFragment) && ((*(uint *)&qualifier->field_0xa & 0x2060e000) != 0)) {
    return true;
  }
  uVar1 = *(uint *)&qualifier->field_0x8 >> 7 & 0x1ff;
  bVar3 = 0;
  switch(uVar1) {
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
    bVar3 = (this->super_TParseContextBase).super_TParseVersions.language == EShLangVertex;
    break;
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x20:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x3a:
  case 0x3c:
  case 0x3d:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
    break;
  case 0x1e:
  case 0x1f:
    EVar2 = (this->super_TParseContextBase).super_TParseVersions.language;
    bVar3 = 1;
    if (EShLangCompute < EVar2) break;
    bVar3 = 0xe;
    goto LAB_00395c71;
  case 0x21:
  case 0x22:
    EVar2 = (this->super_TParseContextBase).super_TParseVersions.language;
    bVar3 = EVar2 != EShLangCompute && EVar2 != EShLangVertex;
    break;
  case 0x33:
    bVar3 = (this->super_TParseContextBase).super_TParseVersions.language - EShLangTessControl < 3;
    break;
  case 0x34:
    EVar2 = (this->super_TParseContextBase).super_TParseVersions.language;
    if (EShLangFragment < EVar2) {
      bVar3 = 0;
      break;
    }
    bVar3 = 0x1a;
LAB_00395c71:
    bVar3 = bVar3 >> ((byte)EVar2 & 0x1f);
    break;
  case 0x35:
  case 0x36:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
    bVar3 = (this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment;
    break;
  case 0x37:
    bVar3 = (this->super_TParseContextBase).super_TParseVersions.language - EShLangTessControl < 2;
    break;
  case 0x38:
  case 0x39:
  case 0x3b:
    bVar3 = (this->super_TParseContextBase).super_TParseVersions.language == EShLangTessEvaluation;
    break;
  case 0x50:
    bVar3 = (this->super_TParseContextBase).super_TParseVersions.language != EShLangCompute;
    break;
  default:
    if (uVar1 - 1 < 6) {
      bVar3 = (this->super_TParseContextBase).super_TParseVersions.language == EShLangCompute;
    }
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool HlslParseContext::hasInput(const TQualifier& qualifier) const
{
    if (qualifier.hasAnyLocation())
        return true;

    if (language == EShLangFragment && (qualifier.isInterpolation() || qualifier.centroid || qualifier.sample))
        return true;

    if (language == EShLangTessEvaluation && qualifier.patch)
        return true;

    if (isInputBuiltIn(qualifier))
        return true;

    return false;
}